

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QMdiSubWindow * __thiscall
QMdiArea::addSubWindow(QMdiArea *this,QWidget *widget,WindowFlags windowFlags)

{
  Int IVar1;
  QWidget *pQVar2;
  qsizetype qVar3;
  QWidget *in_RSI;
  QMdiSubWindow *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000008;
  QWidget *in_stack_00000010;
  QWidget *in_stack_00000028;
  QWidget *childFocus;
  QMdiAreaPrivate *d;
  QMdiSubWindow *child;
  WindowFlags in_stack_00000150;
  QMdiSubWindow **in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  QMessageLogger *in_stack_ffffffffffffff60;
  QMdiSubWindow *in_stack_ffffffffffffff98;
  char local_58 [11];
  undefined1 in_stack_ffffffffffffffb3;
  WidgetAttribute in_stack_ffffffffffffffb4;
  QWidget *in_stack_ffffffffffffffb8;
  QMdiAreaPrivate *in_stack_ffffffffffffffc0;
  QMdiSubWindow *local_38;
  char local_30 [28];
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffffec;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(char *)in_stack_ffffffffffffff48);
    QMessageLogger::warning(local_30,"QMdiArea::addSubWindow: null pointer to widget");
    local_38 = (QMdiSubWindow *)0x0;
  }
  else {
    d_func((QMdiArea *)0x613900);
    pQVar2 = QWidget::focusWidget((QWidget *)0x61390f);
    local_38 = qobject_cast<QMdiSubWindow*>((QObject *)0x61391e);
    if (local_38 == (QMdiSubWindow *)0x0) {
      local_38 = (QMdiSubWindow *)operator_new(0x28);
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff50);
      QMdiSubWindow::QMdiSubWindow(in_RDI,in_RSI,(WindowFlags)in_stack_ffffffffffffffec.i);
      QWidget::setAttribute
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,(bool)in_stack_ffffffffffffffb3
                );
      QMdiSubWindow::setWidget(in_stack_ffffffffffffff98,in_stack_00000028);
    }
    else {
      qVar3 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                        ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x613952);
      if (qVar3 != -1) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(char *)in_stack_ffffffffffffff48
                  );
        QMessageLogger::warning(local_58,"QMdiArea::addSubWindow: window is already added");
        goto LAB_00613a98;
      }
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff50);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int(local_c);
      if (IVar1 == 0) {
        QWidget::windowFlags(in_stack_ffffffffffffff50);
      }
      QWidget::setParent(in_stack_00000010,in_stack_00000008,in_stack_00000150);
    }
    QMdiAreaPrivate::appendChild
              (in_stack_ffffffffffffffc0,(QMdiSubWindow *)in_stack_ffffffffffffffb8);
    if (pQVar2 != (QWidget *)0x0) {
      QWidget::setFocus((QWidget *)0x613a8b);
    }
  }
LAB_00613a98:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

QMdiSubWindow *QMdiArea::addSubWindow(QWidget *widget, Qt::WindowFlags windowFlags)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::addSubWindow: null pointer to widget");
        return nullptr;
    }

    Q_D(QMdiArea);
    // QWidget::setParent clears focusWidget so store it
    QWidget *childFocus = widget->focusWidget();
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget);

    // Widget is already a QMdiSubWindow
    if (child) {
        if (Q_UNLIKELY(d->childWindows.indexOf(child) != -1)) {
            qWarning("QMdiArea::addSubWindow: window is already added");
            return child;
        }
        child->setParent(viewport(), windowFlags ? windowFlags : child->windowFlags());
    // Create a QMdiSubWindow
    } else {
        child = new QMdiSubWindow(viewport(), windowFlags);
        child->setAttribute(Qt::WA_DeleteOnClose);
        child->setWidget(widget);
        Q_ASSERT(child->testAttribute(Qt::WA_DeleteOnClose));
    }

    d->appendChild(child);

    if (childFocus)
        childFocus->setFocus();

    return child;
}